

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_traverse_sequence_of
              (uchar **p,uchar *end,uchar tag_must_mask,uchar tag_must_val,uchar tag_may_mask,
              uchar tag_may_val,_func_int_void_ptr_int_uchar_ptr_size_t *cb,void *ctx)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  size_t local_38;
  size_t len;
  
  puVar2 = *p;
  if (end == puVar2 || (long)end - (long)puVar2 < 0) {
    iVar4 = -0x60;
  }
  else if (*puVar2 == '0') {
    *p = puVar2 + 1;
    iVar4 = mbedtls_asn1_get_len(p,end,&local_38);
    if (iVar4 == 0) {
      pbVar6 = *p;
      iVar4 = -0x66;
      if (pbVar6 + local_38 == end) {
        iVar4 = 0;
        while (pbVar6 < end) {
          *p = pbVar6 + 1;
          bVar1 = *pbVar6;
          if ((bVar1 & tag_must_mask) != tag_must_val) goto LAB_0020ed8e;
          iVar5 = mbedtls_asn1_get_len(p,end,&local_38);
          sVar3 = local_38;
          if (iVar5 != 0) {
            return iVar5;
          }
          if (((cb != (_func_int_void_ptr_int_uchar_ptr_size_t *)0x0) &&
              ((bVar1 & tag_may_mask) == tag_may_val)) &&
             (iVar5 = (*cb)(ctx,(int)bVar1,*p,local_38), iVar5 != 0)) {
            return iVar5;
          }
          pbVar6 = *p + sVar3;
          *p = pbVar6;
        }
      }
    }
  }
  else {
LAB_0020ed8e:
    iVar4 = -0x62;
  }
  return iVar4;
}

Assistant:

int mbedtls_asn1_traverse_sequence_of(
    unsigned char **p,
    const unsigned char *end,
    unsigned char tag_must_mask, unsigned char tag_must_val,
    unsigned char tag_may_mask, unsigned char tag_may_val,
    int (*cb)(void *ctx, int tag,
              unsigned char *start, size_t len),
    void *ctx)
{
    int ret;
    size_t len;

    /* Get main sequence tag */
    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (*p + len != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    while (*p < end) {
        unsigned char const tag = *(*p)++;

        if ((tag & tag_must_mask) != tag_must_val) {
            return MBEDTLS_ERR_ASN1_UNEXPECTED_TAG;
        }

        if ((ret = mbedtls_asn1_get_len(p, end, &len)) != 0) {
            return ret;
        }

        if ((tag & tag_may_mask) == tag_may_val) {
            if (cb != NULL) {
                ret = cb(ctx, tag, *p, len);
                if (ret != 0) {
                    return ret;
                }
            }
        }

        *p += len;
    }

    return 0;
}